

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_compute_euclidean(float64 ***out,uint32 ***w_idx,vector_t *obs,gauden_t *g)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float64 *pfVar4;
  uint32 *puVar5;
  vector_t pfVar6;
  vector_t *ppfVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  float64 fVar18;
  double dVar19;
  
  uVar14 = 0;
  do {
    if (g->n_mgau <= uVar14) {
      return 0;
    }
    for (uVar16 = 0; uVar16 < g->n_feat; uVar16 = uVar16 + 1) {
      pfVar4 = out[uVar14][uVar16];
      puVar5 = w_idx[uVar14][uVar16];
      uVar1 = g->n_top;
      uVar9 = (ulong)uVar1;
      uVar2 = g->n_density;
      uVar3 = g->veclen[uVar16];
      pfVar6 = obs[uVar16];
      ppfVar7 = g->mean[uVar14][uVar16];
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        pfVar4[uVar8] = 1.8e+307;
      }
      uVar15 = (ulong)(uVar1 - 1);
      fVar18 = pfVar4[uVar15];
      for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
        uVar13 = 0;
        for (dVar17 = 0.0; (uVar13 < uVar3 && (dVar17 < (double)fVar18));
            dVar17 = dVar17 + dVar19 * dVar19) {
          dVar19 = (double)(pfVar6[uVar13] - ppfVar7[uVar8][uVar13]);
          uVar13 = uVar13 + 1;
        }
        if (dVar17 < (double)fVar18) {
          for (uVar13 = 0; uVar11 = uVar15, uVar12 = uVar1, uVar10 = uVar9, uVar9 != uVar13;
              uVar13 = uVar13 + 1) {
            if (dVar17 < (double)pfVar4[uVar13]) {
              uVar12 = (uint)uVar13;
              uVar10 = uVar13;
              break;
            }
          }
          while (uVar10 < uVar11) {
            uVar13 = uVar11 - 1 & 0xffffffff;
            pfVar4[uVar11] = pfVar4[uVar13];
            puVar5[uVar11] = puVar5[uVar13];
            uVar11 = uVar11 - 1;
          }
          if (uVar12 != (uint)uVar11) {
            __assert_fail("j == k",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x463,
                          "void euclidean_dist(float64 *, uint32 *, uint32, uint32, uint32, vector_t, vector_t *)"
                         );
          }
          pfVar4[uVar10] = (float64)dVar17;
          puVar5[uVar10] = (uint32)uVar8;
          fVar18 = pfVar4[uVar15];
        }
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

int
gauden_compute_euclidean(float64 ***out,
			 uint32 ***w_idx,
			 vector_t *obs,
			 gauden_t *g)
{
    uint32 i, j;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {

	    euclidean_dist(out[i][j],
			   w_idx[i][j],
			   g->n_top,
			   g->n_density,
			   g->veclen[j],
			   obs[j],
			   g->mean[i][j]);
	    
#ifdef GAUDEN_VERBOSE
	    gauden_print(stdout,
			 out, w_idx, g,
			 NULL, 0);
#endif
	}
    }

    return S3_SUCCESS;
}